

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.c++
# Opt level: O3

void __thiscall
capnp::JsonCodec::decodeObject
          (JsonCodec *this,Reader input,StructSchema type,Orphanage orphanage,Builder output)

{
  Field fieldSchema;
  Reader fieldValue;
  undefined8 uVar1;
  WirePointer *pWVar2;
  ElementCount index;
  bool bVar3;
  StringPtr name;
  DebugExpression<bool> _kjCondition_1;
  StructSchema type_local;
  Reader field;
  Fault f_1;
  Fault f;
  anon_union_64_1_a8c68091_for_NullableValue<capnp::StructSchema::Field>_2 aaStack_160 [2];
  StructReader local_d8;
  DebugExpression<bool> _kjCondition;
  ListReader local_60;
  
  type_local = type;
  if (input._reader.dataSize < 0x10) {
    _kjCondition.value = false;
  }
  else {
    _kjCondition.value = *input._reader.data == 5;
    if (_kjCondition.value) {
      bVar3 = input._reader.pointerCount == 0;
      aaStack_160[0]._8_8_ = input._reader.pointers;
      if (bVar3) {
        aaStack_160[0]._8_8_ = (WirePointer *)0x0;
      }
      aaStack_160[0]._16_4_ = 0x7fffffff;
      if (!bVar3) {
        aaStack_160[0]._16_4_ = input._reader.nestingLimit;
      }
      f.exception._0_4_ = 0;
      f.exception._4_4_ = 0;
      aaStack_160[0]._0_4_ = 0;
      aaStack_160[0]._4_4_ = 0;
      if (!bVar3) {
        f.exception._0_4_ = input._reader.segment._0_4_;
        f.exception._4_4_ = input._reader.segment._4_4_;
        aaStack_160[0]._0_4_ = input._reader.capTable._0_4_;
        aaStack_160[0]._4_4_ = input._reader.capTable._4_4_;
      }
      capnp::_::PointerReader::getList(&local_60,(PointerReader *)&f,INLINE_COMPOSITE,(word *)0x0);
      if (local_60.elementCount == 0) {
        return;
      }
      index = 0;
      do {
        capnp::_::ListReader::getStructElement(&field._reader,&local_60,index);
        f_1.exception._0_4_ = 0;
        f_1.exception._4_4_ = 0;
        if (field._reader.pointerCount != 0) {
          f_1.exception._0_4_ = field._reader.segment._0_4_;
          f_1.exception._4_4_ = field._reader.segment._4_4_;
        }
        name.content = (ArrayPtr<const_char>)
                       capnp::_::PointerReader::getBlob<capnp::Text>
                                 ((PointerReader *)&f_1,(void *)0x0,0);
        StructSchema::findFieldByName((Maybe<capnp::StructSchema::Field> *)&f,&type_local,name);
        if ((char)f.exception == '\x01') {
          uVar1 = aaStack_160[0].value.parent.super_Schema.raw;
          fieldSchema.proto._reader.segment._4_4_ = aaStack_160[0]._20_4_;
          fieldSchema.proto._reader.segment._0_4_ = aaStack_160[0]._16_4_;
          pWVar2 = field._reader.pointers + 1;
          f.exception._0_4_ = field._reader.segment._0_4_;
          f.exception._4_4_ = field._reader.segment._4_4_;
          aaStack_160[0]._0_4_ = field._reader.capTable._0_4_;
          aaStack_160[0]._4_4_ = field._reader.capTable._4_4_;
          aaStack_160[0]._16_4_ = field._reader.nestingLimit;
          if (field._reader.pointerCount < 2) {
            pWVar2 = (WirePointer *)0x0;
            f.exception._0_4_ = 0;
            f.exception._4_4_ = 0;
            aaStack_160[0]._0_4_ = 0;
            aaStack_160[0]._4_4_ = 0;
            aaStack_160[0]._16_4_ = 0x7fffffff;
          }
          capnp::_::PointerReader::getStruct(&local_d8,(PointerReader *)&f,(word *)0x0);
          fieldSchema._8_8_ = aaStack_160[0]._8_8_;
          fieldSchema.parent.super_Schema.raw = (Schema)(Schema)uVar1;
          fieldSchema.proto._reader.capTable = (CapTableReader *)aaStack_160[0]._24_8_;
          fieldSchema.proto._reader.data = (void *)aaStack_160[0]._32_8_;
          fieldSchema.proto._reader.pointers = (WirePointer *)aaStack_160[0]._40_8_;
          fieldSchema.proto._reader._32_8_ = aaStack_160[0]._48_8_;
          fieldSchema.proto._reader._40_8_ = aaStack_160[0]._56_8_;
          fieldValue._reader.capTable = local_d8.capTable;
          fieldValue._reader.segment = local_d8.segment;
          fieldValue._reader.data = local_d8.data;
          fieldValue._reader.pointers = local_d8.pointers;
          fieldValue._reader.dataSize = local_d8.dataSize;
          fieldValue._reader.pointerCount = local_d8.pointerCount;
          fieldValue._reader._38_2_ = local_d8._38_2_;
          fieldValue._reader.nestingLimit = local_d8.nestingLimit;
          fieldValue._reader._44_4_ = local_d8._44_4_;
          decodeField(this,fieldSchema,fieldValue,orphanage,output);
          aaStack_160[0]._8_8_ = pWVar2;
        }
        else {
          bVar3 = ((this->impl).ptr)->rejectUnknownFields;
          _kjCondition_1.value = (bool)(bVar3 ^ 1);
          if (bVar3 != false) {
            _f = (ArrayPtr<const_char>)json::Value::Field::Reader::getName(&field);
            kj::_::Debug::Fault::
            Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[14],capnp::Text::Reader>
                      (&f_1,
                       "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
                       ,399,FAILED,"!impl->rejectUnknownFields",
                       "_kjCondition,\"Unknown field\", field.getName()",&_kjCondition_1,
                       (char (*) [14])"Unknown field",(Reader *)&f);
            kj::_::Debug::Fault::fatal(&f_1);
          }
        }
        index = index + 1;
      } while (local_60.elementCount != index);
      return;
    }
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[22]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/compat/json.c++"
             ,0x18a,FAILED,"input.isObject()","_kjCondition,\"Expected object value\"",&_kjCondition
             ,(char (*) [22])"Expected object value");
  kj::_::Debug::Fault::~Fault(&f);
  return;
}

Assistant:

void JsonCodec::decodeObject(JsonValue::Reader input, StructSchema type, Orphanage orphanage, DynamicStruct::Builder output) const {
  KJ_REQUIRE(input.isObject(), "Expected object value") { return; }
  for (auto field: input.getObject()) {
    KJ_IF_SOME(fieldSchema, type.findFieldByName(field.getName())) {
      decodeField(fieldSchema, field.getValue(), orphanage, output);
    } else {
      KJ_REQUIRE(!impl->rejectUnknownFields, "Unknown field", field.getName());
    }
  }